

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeglobpattern.cpp
# Opt level: O2

PatternType __thiscall
QMimeGlobPattern::detectPatternType(QMimeGlobPattern *this,QStringView pattern)

{
  long lVar1;
  bool bVar2;
  PatternType PVar3;
  qsizetype qVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long in_FS_OFFSET;
  QLatin1StringView local_50;
  QStringView pattern_local;
  
  pattern_local.m_data = pattern.m_data;
  lVar7 = pattern.m_size;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pattern_local.m_size = lVar7;
  if (lVar7 == 0) {
    PVar3 = OtherPattern;
    goto LAB_00444ae3;
  }
  qVar4 = QStringView::count(&pattern_local,(QChar)0x2a,CaseSensitive);
  uVar5 = QStringView::indexOf(&pattern_local,(QChar)0x5b,0,CaseSensitive);
  uVar6 = QStringView::indexOf(&pattern_local,(QChar)0x3f,0,CaseSensitive);
  if ((uVar6 & uVar5) == 0xffffffffffffffff) {
    if (qVar4 == 0) {
      PVar3 = LiteralPattern;
      goto LAB_00444ae3;
    }
    if ((qVar4 == 1) &&
       ((PVar3 = SuffixPattern, *pattern_local.m_data == L'*' ||
        (PVar3 = PrefixPattern, pattern_local.m_data[lVar7 + -1] == L'*')))) goto LAB_00444ae3;
  }
  local_50.m_size = 0x13;
  local_50.m_data = "[0-9][0-9][0-9].vdr";
  bVar2 = ::comparesEqual(&local_50,&pattern_local);
  if (bVar2) {
    PVar3 = VdrPattern;
  }
  else {
    local_50.m_size = 0xc;
    local_50.m_data = "*.anim[1-9j]";
    bVar2 = ::comparesEqual(&local_50,&pattern_local);
    PVar3 = bVar2 ^ OtherPattern;
  }
LAB_00444ae3:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return PVar3;
}

Assistant:

QMimeGlobPattern::PatternType QMimeGlobPattern::detectPatternType(QStringView pattern) const
{
    const qsizetype patternLength = pattern.size();
    if (!patternLength)
        return OtherPattern;

    const qsizetype starCount = pattern.count(u'*');
    const bool hasSquareBracket = pattern.indexOf(u'[') != -1;
    const bool hasQuestionMark = pattern.indexOf(u'?') != -1;

    if (!hasSquareBracket && !hasQuestionMark) {
        if (starCount == 1) {
            // Patterns like "*~", "*.extension"
            if (pattern.at(0) == u'*')
                return SuffixPattern;
            // Patterns like "README*" (well this is currently the only one like that...)
            if (pattern.at(patternLength - 1) == u'*')
                return PrefixPattern;
        } else if (starCount == 0) {
            // Names without any wildcards like "README"
            return LiteralPattern;
        }
    }

    if (pattern == "[0-9][0-9][0-9].vdr"_L1)
        return VdrPattern;

    if (pattern == "*.anim[1-9j]"_L1)
        return AnimPattern;

    return OtherPattern;
}